

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeViewPrivate::coordinateForItem(QTreeViewPrivate *this,int item)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((this->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerPixel) {
    if (this->uniformRowHeights != false) {
      iVar4 = this->defaultItemHeight;
      iVar1 = QAbstractSlider::value
                        (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                          vbar)->super_QAbstractSlider);
      return item * iVar4 - iVar1;
    }
    if ((this->viewItems).d.size != 0) {
      uVar5 = 0;
      iVar4 = 0;
      do {
        if ((uint)item == uVar5) {
          iVar1 = QAbstractSlider::value
                            (&((this->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.vbar)->super_QAbstractSlider);
          return iVar4 - iVar1;
        }
        iVar1 = itemHeight(this,(int)uVar5);
        iVar4 = iVar4 + iVar1;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(this->viewItems).d.size);
    }
  }
  else {
    iVar4 = QAbstractSlider::value
                      (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        vbar)->super_QAbstractSlider);
    if (this->uniformRowHeights == true) {
      return (item - iVar4) * this->defaultItemHeight;
    }
    if (iVar4 <= item) {
      if (item == iVar4) {
        return 0;
      }
      lVar3 = (long)iVar4;
      if ((this->viewItems).d.size <= lVar3) {
        return 0;
      }
      iVar1 = 0;
      do {
        lVar3 = lVar3 + 1;
        iVar2 = itemHeight(this,iVar4);
        iVar1 = iVar2 + iVar1;
        if (item + -1 == iVar4) {
          return iVar1;
        }
        iVar4 = iVar4 + 1;
      } while (lVar3 < (this->viewItems).d.size);
      return iVar1;
    }
    if (0 < iVar4) {
      iVar1 = 0;
      do {
        iVar2 = itemHeight(this,iVar4 + -1);
        iVar1 = iVar1 - iVar2;
        if (iVar4 < 2) {
          return iVar1;
        }
        bVar6 = item + 1 != iVar4;
        iVar4 = iVar4 + -1;
      } while (bVar6);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int QTreeViewPrivate::coordinateForItem(int item) const
{
    if (verticalScrollMode == QAbstractItemView::ScrollPerPixel) {
        if (uniformRowHeights)
            return (item * defaultItemHeight) - vbar->value();
        // ### optimize (maybe do like QHeaderView by letting items have startposition)
        int y = 0;
        for (int i = 0; i < viewItems.size(); ++i) {
            if (i == item)
                return y - vbar->value();
            y += itemHeight(i);
        }
    } else { // ScrollPerItem
        int topViewItemIndex = vbar->value();
        if (uniformRowHeights)
            return defaultItemHeight * (item - topViewItemIndex);
        if (item >= topViewItemIndex) {
            // search in the visible area first and continue down
            // ### slow if the item is not visible
            int viewItemCoordinate = 0;
            int viewItemIndex = topViewItemIndex;
            while (viewItemIndex < viewItems.size()) {
                if (viewItemIndex == item)
                    return viewItemCoordinate;
                viewItemCoordinate += itemHeight(viewItemIndex);
                ++viewItemIndex;
            }
            // below the last item in the view
            Q_ASSERT(false);
            return viewItemCoordinate;
        } else {
            // search the area above the viewport (used for editor widgets)
            int viewItemCoordinate = 0;
            for (int viewItemIndex = topViewItemIndex; viewItemIndex > 0; --viewItemIndex) {
                if (viewItemIndex == item)
                    return viewItemCoordinate;
                viewItemCoordinate -= itemHeight(viewItemIndex - 1);
            }
            return viewItemCoordinate;
        }
    }
    return 0;
}